

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O1

void __thiscall QtMWidgets::PageViewPrivate::PageViewPrivate(PageViewPrivate *this,PageView *parent)

{
  this->q = parent;
  this->viewport = (QWidget *)0x0;
  this->control = (PageControl *)0x0;
  this->showPageControl = true;
  this->pagesOffset = 0;
  this->normalizeAnimation = (QVariantAnimation *)0x0;
  (this->pages).d.d = (Data *)0x0;
  (this->pages).d.ptr = (QWidget **)0x0;
  *(undefined8 *)((long)&(this->pages).d.ptr + 5) = 0;
  *(undefined8 *)((long)&(this->pages).d.size + 5) = 0;
  (this->pos).xp = 0;
  (this->pos).yp = 0;
  this->pagesPrepared = false;
  this->indexAfterNormalizeAnimation = -1;
  init(this,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

PageViewPrivate( PageView * parent )
		:	q( parent )
		,	viewport( 0 )
		,	control( 0 )
		,	showPageControl( true )
		,	controlOffset( 0 )
		,	leftButtonPressed( false )
		,	pagesPrepared( false )
		,	pagesOffset( 0 )
		,	normalizeAnimation( 0 )
		,	indexAfterNormalizeAnimation( -1 )
	{
		init();
	}